

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::ext_ems_parse_clienthello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  bool bVar1;
  uint16_t uVar2;
  
  uVar2 = ssl_protocol_version(hs->ssl);
  bVar1 = true;
  if ((contents != (CBS *)0x0) && (uVar2 < 0x304)) {
    if (contents->len == 0) {
      hs->field_0x6ca = hs->field_0x6ca | 2;
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

static bool ext_ems_parse_clienthello(SSL_HANDSHAKE *hs, uint8_t *out_alert,
                                      CBS *contents) {
  if (ssl_protocol_version(hs->ssl) >= TLS1_3_VERSION) {
    return true;
  }

  if (contents == NULL) {
    return true;
  }

  if (CBS_len(contents) != 0) {
    return false;
  }

  hs->extended_master_secret = true;
  return true;
}